

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

ImGuiStoragePair * __thiscall
ImVector<ImGuiStorage::ImGuiStoragePair>::insert
          (ImVector<ImGuiStorage::ImGuiStoragePair> *this,ImGuiStoragePair *it,ImGuiStoragePair *v)

{
  int *piVar1;
  ImGuiStoragePair *pIVar2;
  anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 aVar3;
  int iVar4;
  ulong uVar5;
  ImGuiStoragePair *__dest;
  int iVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  
  __dest = this->Data;
  if ((it < __dest) || (uVar5 = (ulong)this->Size, __dest + uVar5 < it)) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0x61f,"insert","ImGui ASSERT FAILED: %s","it >= Data && it <= Data + Size");
    __dest = this->Data;
    uVar5 = (ulong)(uint)this->Size;
  }
  lVar8 = (long)it - (long)__dest;
  iVar4 = (int)uVar5;
  if (iVar4 == this->Capacity) {
    if (iVar4 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = ((int)(((uint)(uVar5 >> 0x1f) & 1) + iVar4) >> 1) + iVar4;
    }
    iVar9 = iVar4 + 1;
    if (iVar4 + 1 < iVar6) {
      iVar9 = iVar6;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiStoragePair *)(*GImAllocatorAllocFunc)((long)iVar9 << 4,GImAllocatorUserData);
    if (this->Data != (ImGuiStoragePair *)0x0) {
      memcpy(__dest,this->Data,(long)this->Size << 4);
      pIVar2 = this->Data;
      if ((pIVar2 != (ImGuiStoragePair *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    this->Data = __dest;
    this->Capacity = iVar9;
    iVar4 = this->Size;
  }
  lVar7 = (long)iVar4 - (lVar8 >> 4);
  if (lVar7 != 0 && lVar8 >> 4 <= (long)iVar4) {
    memmove((void *)((long)__dest + lVar8 + 0x10),(void *)((long)__dest + lVar8),lVar7 * 0x10);
    __dest = this->Data;
  }
  aVar3 = v->field_1;
  *(undefined8 *)((long)__dest + lVar8) = *(undefined8 *)v;
  *(anon_union_8_3_a9ee5d6f_for_ImGuiStoragePair_1 *)((undefined8 *)((long)__dest + lVar8) + 1) =
       aVar3;
  this->Size = this->Size + 1;
  return (ImGuiStoragePair *)(lVar8 + (long)this->Data);
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data + Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }